

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O2

void savebones(obj *corpse)

{
  byte *pbVar1;
  permonst *ppVar2;
  fruit *pfVar3;
  level *plVar4;
  char cVar5;
  xchar levnum;
  int iVar6;
  fruit **ppfVar7;
  obj *poVar8;
  monst *pmVar9;
  char *str;
  size_t sVar10;
  trap *ptVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char c;
  char bonesid [10];
  char whynot [256];
  memfile mf;
  
  mnew(&mf,(memfile *)0x0);
  clear_bypasses();
  make_bones_id(bonesid,&u.uz);
  iVar6 = open_bonesfile(bonesid);
  if (-1 < iVar6) {
    close(iVar6);
    if (flags.debug == '\0') {
      return;
    }
    cVar5 = yn_function("Bones file already exists.  Replace it?","yn",'n');
    if (cVar5 != 'y') {
      return;
    }
    iVar6 = delete_bonesfile(bonesid);
    if (iVar6 == 0) {
      pline("Cannot unlink old bones.");
      return;
    }
  }
  unleash_all();
  pmVar9 = (monst *)&level->monlist;
  while (pmVar9 = pmVar9->nmon, pmVar9 != (monst *)0x0) {
    if ((0 < pmVar9->mhp) &&
       (((ppVar2 = pmVar9->data, ppVar2 == mons + 0x127 || (pmVar9->field_0x63 & 0x20) != 0 ||
         (ppVar2->msound == ' ')) ||
        ((ppVar2 == mons + 0x143 || ppVar2 == mons + 0xea) || ppVar2->msound == '\x1f')))) {
      mongone(pmVar9);
    }
  }
  if (u.usteed != (monst *)0x0) {
    dismount_steed(5);
  }
  dmonsfree(level);
  ppfVar7 = &ffruit;
  while (pfVar3 = *ppfVar7, pfVar3 != (fruit *)0x0) {
    pfVar3->fid = -pfVar3->fid;
    ppfVar7 = &pfVar3->nextf;
  }
  if (uball != (obj *)0x0) {
    pbVar1 = (byte *)((long)&uball->owornmask + 2);
    *pbVar1 = *pbVar1 & 0xdf;
    uchain->owornmask = uchain->owornmask & 0xffbfffff;
  }
  poVar8 = uarm;
  if (((uarm != (obj *)0x0) && ((ushort)(uarm->otyp - 0x54U) < 0x16)) &&
     ((obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
      (iVar6 = strncmp(obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr,"gold ",5),
      iVar6 == 0)))) {
    end_burn(poVar8,'\0');
  }
  if ((ulong)(uint)u.ugrave_arise == 0xfffffffe) {
    poVar8 = mk_named_object(0x215,mons + u.umonnum,(int)u.ux,(int)u.uy,plname);
    drop_upon_death((monst *)0x0,poVar8);
    if (poVar8 == (obj *)0x0) {
      return;
    }
    goto LAB_00152299;
  }
  if (urace.malenum == 0xe8) {
    drop_upon_death((monst *)0x0,(obj *)0x0);
    u.ugrave_arise = -1;
    goto LAB_00152299;
  }
  if (u.ugrave_arise < 0) {
    drop_upon_death((monst *)0x0,(obj *)0x0);
    in_mklev = '\x01';
    pmVar9 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0x20);
    in_mklev = '\0';
    if (pmVar9 == (monst *)0x0) {
      in_mklev = '\0';
      return;
    }
    pmVar9 = christen_monst(pmVar9,plname);
    if (corpse == (obj *)0x0) goto LAB_001521cc;
    obj_attach_mid(corpse,pmVar9->m_id);
  }
  else {
    in_mklev = '\x01';
    pmVar9 = makemon(mons + (uint)u.ugrave_arise,level,(int)u.ux,(int)u.uy,0);
    in_mklev = '\0';
    if (pmVar9 == (monst *)0x0) {
      drop_upon_death((monst *)0x0,(obj *)0x0);
      return;
    }
    pmVar9 = christen_monst(pmVar9,plname);
    newsym((int)u.ux,(int)u.uy);
    str = mons_mname(mons + u.ugrave_arise);
    an(str);
    pline("Your body rises from the dead as %s...");
    (*windowprocs.win_pause)(P_MESSAGE);
    drop_upon_death(pmVar9,(obj *)0x0);
    m_dowear(level,pmVar9,'\x01');
LAB_001521cc:
    if (pmVar9 == (monst *)0x0) goto LAB_00152299;
  }
  pmVar9->m_lev = (char)u.ulevel + (u.ulevel == 0);
  iVar6 = u.uhpmax;
  pmVar9->mhpmax = u.uhpmax;
  pmVar9->mhp = iVar6;
  *(uint *)&pmVar9->field_0x60 =
       ((byte)flags.female & 1) + (*(uint *)&pmVar9->field_0x60 & 0xfff7fffe) + 0x80000;
LAB_00152299:
  pmVar9 = (monst *)&level->monlist;
  while (plVar4 = level, pmVar9 = pmVar9->nmon, pmVar9 != (monst *)0x0) {
    resetobjs(pmVar9->minvent,'\0');
    pmVar9->mlstmv = 0;
    if (pmVar9->mtame != '\0') {
      pmVar9->field_0x62 = pmVar9->field_0x62 & 0xbf;
      pmVar9->mtame = '\0';
    }
  }
  ptVar11 = (trap *)&level->lev_traps;
  while (ptVar11 = ptVar11->ntrap, ptVar11 != (trap *)0x0) {
    ptVar11->field_0x8 = ptVar11->field_0x8 & 0x5f | ((ptVar11->field_0x8 & 0x1f) == 0xd) << 5;
  }
  resetobjs(plVar4->objlist,'\0');
  resetobjs(level->buriedobjlist,'\0');
  u.ux = '\0';
  u.uy = '\0';
  lVar12 = 0x46;
  for (lVar14 = 0; lVar14 != 0x50; lVar14 = lVar14 + 1) {
    lVar15 = lVar12;
    for (lVar13 = 0; plVar4 = level, lVar13 != 0x15; lVar13 = lVar13 + 1) {
      level->levname[lVar15 + -1] = '\0';
      plVar4->levname[lVar15 + 1] = plVar4->levname[lVar15 + 1] & 0xf7;
      clear_memory_glyph((schar)lVar14,(schar)lVar13,0);
      lVar15 = lVar15 + 0xc;
    }
    lVar12 = lVar12 + 0xfc;
  }
  iVar6 = create_bonesfile(bonesid,whynot);
  if (iVar6 < 0) {
    if (flags.debug != '\0') {
      pline("%s",whynot);
    }
    paniclog("savebones",whynot);
  }
  else {
    sVar10 = strlen(bonesid);
    c = (char)sVar10 + '\x01';
    store_version(&mf);
    mwrite(&mf,&c,1);
    mwrite(&mf,bonesid,(int)c);
    savefruitchn(&mf);
    update_mlstmv();
    levnum = ledger_no(&u.uz);
    savelev(&mf,levnum);
    store_mf(iVar6,&mf);
    close(iVar6);
    commit_bonesfile(bonesid);
  }
  return;
}

Assistant:

void savebones(struct obj *corpse)
{
	int fd, x, y;
	struct trap *ttmp;
	struct monst *mtmp;
	const struct permonst *mptr;
	struct fruit *f;
	char c, whynot[BUFSZ], bonesid[10];
	struct memfile mf;

	mnew(&mf, NULL);

	/* caller has already checked `can_make_bones()' */

	clear_bypasses();
	make_bones_id(bonesid, &u.uz);
	fd = open_bonesfile(bonesid);
	if (fd >= 0) {
		close(fd);
		if (wizard) {
		    if (yn("Bones file already exists.  Replace it?") == 'y') {
			if (delete_bonesfile(bonesid)) goto make_bones;
			else pline("Cannot unlink old bones.");
		    }
		}
		return;
	}

make_bones:
	unleash_all();
	/* in case these characters are not in their home bases */
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    mptr = mtmp->data;
	    if (mtmp->iswiz || mptr == &mons[PM_MEDUSA] ||
		    mptr->msound == MS_NEMESIS || mptr->msound == MS_LEADER ||
		    mptr == &mons[PM_VLAD_THE_IMPALER] ||
		    mptr == &mons[PM_CTHULHU])
		mongone(mtmp);
	}
	if (u.usteed) dismount_steed(DISMOUNT_BONES);
		dmonsfree(level);	/* discard dead or gone monsters */

	/* mark all fruits as nonexistent; when we come to them we'll mark
	 * them as existing (using goodfruit())
	 */
	for (f=ffruit; f; f=f->nextf) f->fid = -f->fid;

	/* check iron balls separately--maybe they're not carrying it */
	if (uball) {
		uball->owornmask &= ~W_BALL;
		uchain->owornmask &= ~W_CHAIN;
	}

	/* extinguish armor */
	if (uarm && Is_gold_dragon_armor(uarm->otyp))
	    end_burn(uarm, FALSE);

	/* dispose of your possessions, usually cursed */
	if (u.ugrave_arise == (NON_PM - 1)) {
		struct obj *otmp;

		/* embed your possessions in your statue */
		otmp = mk_named_object(STATUE, &mons[u.umonnum],
				       u.ux, u.uy, plname);

		drop_upon_death(NULL, otmp);
		if (!otmp) return;	/* couldn't make statue */
		mtmp = NULL;
	} else if (Race_if(PM_VAMPIRE)) {
		/* don't let vampires rise as some other monster */
		drop_upon_death(NULL, NULL);
		mtmp = NULL;
		u.ugrave_arise = NON_PM;
	} else if (u.ugrave_arise < LOW_PM) {
		/* drop everything */
		drop_upon_death(NULL, NULL);
		/* trick makemon() into allowing monster creation
		 * on your location
		 */
		in_mklev = TRUE;
		mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, MM_NONAME);
		in_mklev = FALSE;
		if (!mtmp) return;
		mtmp = christen_monst(mtmp, plname);
		if (corpse)
			obj_attach_mid(corpse, mtmp->m_id); 
	} else {
		/* give your possessions to the monster you become */
		in_mklev = TRUE;
		mtmp = makemon(&mons[u.ugrave_arise], level, u.ux, u.uy, NO_MM_FLAGS);
		in_mklev = FALSE;
		if (!mtmp) {
			drop_upon_death(NULL, NULL);
			return;
		}
		mtmp = christen_monst(mtmp, plname);
		newsym(u.ux, u.uy);
		pline("Your body rises from the dead as %s...",
			an(mons_mname(&mons[u.ugrave_arise])));
		win_pause_output(P_MESSAGE);
		drop_upon_death(mtmp, NULL);
		m_dowear(level, mtmp, TRUE);
	}
	if (mtmp) {
		mtmp->m_lev = (u.ulevel ? u.ulevel : 1);
		mtmp->mhp = mtmp->mhpmax = u.uhpmax;
		mtmp->female = flags.female;
		mtmp->msleeping = 1;
	}
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		resetobjs(mtmp->minvent,FALSE);
		/* do not zero out m_ids for bones levels any more */
		mtmp->mlstmv = 0L;
		if (mtmp->mtame) mtmp->mtame = mtmp->mpeaceful = 0;
	}
	for (ttmp = level->lev_traps; ttmp; ttmp = ttmp->ntrap) {
		ttmp->madeby_u = 0;
		ttmp->tseen = (ttmp->ttyp == HOLE);
	}
	resetobjs(level->objlist,FALSE);
	resetobjs(level->buriedobjlist, FALSE);

	/* Hero is no longer on the map. */
	u.ux = u.uy = 0;

	/* Clear all memory from the level. */
	for (x=0; x<COLNO; x++) for(y=0; y<ROWNO; y++) {
	    level->locations[x][y].seenv = 0;
	    level->locations[x][y].waslit = 0;
	    clear_memory_glyph(x, y, S_unexplored);
	}

	fd = create_bonesfile(bonesid, whynot);
	if (fd < 0) {
		if (wizard)
			pline("%s", whynot);

		/* bones file creation problems are silent to the player.
		 * Keep it that way, but place a clue into the paniclog.
		 */
		paniclog("savebones", whynot);
		return;
	}
	c = (char) (strlen(bonesid) + 1);

	store_version(&mf);
	/* No tagging is useful here, as the tags in bones memfiles
	 * aren't used for anything anyway.
	 */
	mwrite(&mf, &c, sizeof c);
	mwrite(&mf, bonesid, (unsigned) c);	/* DD.nnn */
	savefruitchn(&mf);
	update_mlstmv();	/* update monsters for eventual restoration */
	savelev(&mf, ledger_no(&u.uz));
	
	store_mf(fd, &mf);	/* also frees mf */
	
	close(fd);
	commit_bonesfile(bonesid);
}